

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeInstruction
          (AsmWriteWLADX *this,Pointer pc,int numBits,int numBytesUsed,string *param,
          string *line_comment,CombinationBool accumulator_wide,CombinationBool index_wide,
          Combination8 data_bank,Combination16 direct_page,bool is_predicted)

{
  FILE *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  undefined8 uVar10;
  char *pcVar11;
  char local_72;
  int local_64;
  int k_2;
  char *op;
  int local_50;
  int k_1;
  int k;
  bool emitCommentPC;
  int nw;
  bool overrideInstructionWithDB;
  uint8_t *data;
  bool is_predicted_local;
  string *line_comment_local;
  string *param_local;
  int numBytesUsed_local;
  int numBits_local;
  Pointer pc_local;
  AsmWriteWLADX *this_local;
  
  prepareWrite(this,pc,true);
  pbVar8 = snestistics::RomAccessor::evalPtr(this->m_romData,pc);
  bVar3 = false;
  if (((numBytesUsed == 2) && (*pbVar8 == 0xf0)) && (pbVar8[1] == 0x80)) {
    bVar3 = true;
  }
  bVar2 = true;
  if (((this->m_options->asm_print_pc & 1U) == 0) &&
     (bVar2 = true, (this->m_options->asm_print_bytes & 1U) == 0)) {
    bVar2 = bVar3;
  }
  k = fprintf((FILE *)this->m_outFile,"    ");
  if (bVar2) {
    local_72 = 'p';
    if (!is_predicted) {
      local_72 = ' ';
    }
    iVar4 = fprintf((FILE *)this->m_outFile,"/*%c",(ulong)(uint)(int)local_72);
    k = iVar4 + k;
  }
  if ((this->m_options->asm_print_register_sizes & 1U) != 0) {
    if (((uint3)accumulator_wide & 0x10000) == 0) {
      fputc(0x3f,(FILE *)this->m_outFile);
    }
    else if (((uint3)accumulator_wide & 0x100) == 0) {
      fputc(0x2a,(FILE *)this->m_outFile);
    }
    else if (((uint3)accumulator_wide & 1) == 0) {
      fputc(0x6d,(FILE *)this->m_outFile);
    }
    else {
      fputc(0x4d,(FILE *)this->m_outFile);
    }
    if (((uint3)index_wide & 0x10000) == 0) {
      fputc(0x3f,(FILE *)this->m_outFile);
    }
    else if (((uint3)index_wide & 0x100) == 0) {
      fputc(0x2a,(FILE *)this->m_outFile);
    }
    else if (((uint3)index_wide & 1) == 0) {
      fputc(0x69,(FILE *)this->m_outFile);
    }
    else {
      fputc(0x49,(FILE *)this->m_outFile);
    }
    fputc(0x20,(FILE *)this->m_outFile);
    k = k + 3;
  }
  if ((this->m_options->asm_print_db & 1U) != 0) {
    if (((uint3)data_bank & 0x10000) == 0) {
      __assert_fail("data_bank.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x179,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint3)data_bank & 0x100) == 0) {
      iVar4 = fprintf((FILE *)this->m_outFile,"   ");
    }
    else {
      iVar4 = fprintf((FILE *)this->m_outFile,"%02X ",(ulong)data_bank.value);
    }
    k = iVar4 + k;
  }
  if ((this->m_options->asm_print_dp & 1U) != 0) {
    if (((uint)direct_page & 0x1000000) == 0) {
      __assert_fail("direct_page.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x182,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint)direct_page & 0x10000) == 0) {
      iVar4 = fprintf((FILE *)this->m_outFile,"     ");
    }
    else {
      iVar4 = fprintf((FILE *)this->m_outFile,"%04X ",(ulong)direct_page.value);
    }
    k = iVar4 + k;
  }
  if ((this->m_options->asm_print_pc & 1U) != 0) {
    iVar4 = fprintf((FILE *)this->m_outFile,"%06X ",(ulong)pc);
    k = iVar4 + k;
  }
  if ((this->m_options->asm_print_bytes & 1U) != 0) {
    for (local_50 = 0; op._4_4_ = numBytesUsed, local_50 < numBytesUsed; local_50 = local_50 + 1) {
      iVar4 = fprintf((FILE *)this->m_outFile,"%02X ",(ulong)pbVar8[local_50]);
      k = iVar4 + k;
    }
    for (; op._4_4_ < 4; op._4_4_ = op._4_4_ + 1) {
      iVar4 = fprintf((FILE *)this->m_outFile,"   ");
      k = iVar4 + k;
    }
  }
  if ((bVar2) && (!bVar3)) {
    iVar4 = fprintf((FILE *)this->m_outFile,"*/ ");
    k = iVar4 + k;
  }
  pcVar11 = *(char **)(snestistics::opCodeInfo + (ulong)*pbVar8 * 0x18 + 8);
  if ((this->m_options->asm_lower_case_op & 1U) == 0) {
    iVar4 = fprintf((FILE *)this->m_outFile,"%s",pcVar11);
  }
  else {
    pFVar1 = (FILE *)this->m_outFile;
    uVar5 = tolower((int)*pcVar11);
    uVar6 = tolower((int)pcVar11[1]);
    uVar7 = tolower((int)pcVar11[2]);
    iVar4 = fprintf(pFVar1,"%c%c%c",(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
  }
  k = iVar4 + k;
  iVar4 = strcmp(*(char **)(snestistics::opCodeInfo + (ulong)*pbVar8 * 0x18 + 8),"BRL");
  if ((iVar4 != 0) && (numBits != 0)) {
    if (numBits == 8) {
      iVar4 = fprintf((FILE *)this->m_outFile,".b");
    }
    else if (numBits == 0x10) {
      iVar4 = fprintf((FILE *)this->m_outFile,".w");
    }
    else {
      if (numBits != 0x18) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x1ab,
                      "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                     );
      }
      iVar4 = fprintf((FILE *)this->m_outFile,".l");
    }
    k = iVar4 + k;
  }
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    pFVar1 = (FILE *)this->m_outFile;
    uVar10 = std::__cxx11::string::c_str();
    iVar4 = fprintf(pFVar1," %s",uVar10);
    k = iVar4 + k;
  }
  if (bVar3) {
    iVar4 = fprintf((FILE *)this->m_outFile,"*/ ");
    k = iVar4 + k;
  }
  iVar4 = adjusted_column(this,k);
  writeCommentHelper(this,k,iVar4,line_comment);
  if (bVar3) {
    fprintf((FILE *)this->m_outFile,".DB ");
    for (local_64 = 0; local_64 < numBytesUsed; local_64 = local_64 + 1) {
      pcVar11 = "";
      if (local_64 != numBytesUsed + -1) {
        pcVar11 = ", ";
      }
      fprintf((FILE *)this->m_outFile,"$%02X%s",(ulong)pbVar8[local_64],pcVar11);
    }
    fprintf((FILE *)this->m_outFile,"\n");
  }
  this->m_nextPC = pc + numBytesUsed;
  return;
}

Assistant:

void writeInstruction(const Pointer pc, const int numBits, const int numBytesUsed, const std::string &param, const std::string &line_comment, CombinationBool accumulator_wide, CombinationBool index_wide, Combination8 data_bank, Combination16 direct_page, bool is_predicted) {
		prepareWrite(pc);
		const uint8_t* data = m_romData.evalPtr(pc);

		bool overrideInstructionWithDB = false;

		if (numBytesUsed == 2 && data[0] == 0xF0 && data[1] == 0x80) {
			// WLA DX has a bug here, emit using .DB instad
			overrideInstructionWithDB = true;
		}

		// Keep track of bytes written so we can align comment column
		int nw = 0;

		const bool emitCommentPC = m_options.asm_print_pc || m_options.asm_print_bytes || overrideInstructionWithDB;

		nw += fprintf(m_outFile, "    ");
		if (emitCommentPC) {
			nw += fprintf(m_outFile, "/*%c", is_predicted ? 'p':' ');
		}

		if (m_options.asm_print_register_sizes) {
			if(!accumulator_wide.has_value) {
				fputc('?', m_outFile);
			} else if (accumulator_wide.single_value) {
				if (accumulator_wide.value) {
					fputc('M', m_outFile);
				} else {
					fputc('m', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			if(!index_wide.has_value) {
				fputc('?', m_outFile);
			} else if (index_wide.single_value) {
				if (index_wide.value) {
					fputc('I', m_outFile);
				} else {
					fputc('i', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			fputc(' ', m_outFile);
			nw += 3;
		}

		if (m_options.asm_print_db) {
			assert(data_bank.has_value);
			if (data_bank.single_value) {
				nw += fprintf(m_outFile, "%02X ", data_bank.value);
			} else {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (m_options.asm_print_dp) {
			assert(direct_page.has_value);
			if (direct_page.single_value) {
				nw += fprintf(m_outFile, "%04X ", direct_page.value);
			} else {
				nw += fprintf(m_outFile, "     ");
			}
		}

		if (m_options.asm_print_pc) {
			nw += fprintf(m_outFile, "%06X ", pc);
		}
		if (m_options.asm_print_bytes) {
			for (int k = 0; k < numBytesUsed; k++) {
				nw += fprintf(m_outFile, "%02X ", data[k]);
			}
			for (int k = numBytesUsed; k < 4; k++) {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (emitCommentPC && !overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		const char * const op = opCodeInfo[data[0]].mnemonics;
		if (m_options.asm_lower_case_op) {
			nw += fprintf(m_outFile, "%c%c%c", tolower(op[0]), tolower(op[1]), tolower(op[2]));
		} else {
			nw += fprintf(m_outFile, "%s", op);
		}

		if (strcmp(opCodeInfo[data[0]].mnemonics, "BRL") == 0) {

		} else if (numBits == 0) {
		} else if (numBits == 8) {
			nw += fprintf(m_outFile, ".b");
		} else if (numBits == 16) {
			nw += fprintf(m_outFile, ".w");
		} else if (numBits == 24) {
			nw += fprintf(m_outFile, ".l");
		} else {
			assert(false);
		}

		if (!param.empty()) {
			nw += fprintf(m_outFile, " %s", param.c_str());
		}

		if (overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		writeCommentHelper(nw, adjusted_column(nw), line_comment);

		if (overrideInstructionWithDB) {
			fprintf(m_outFile, ".DB ");
			for (int k = 0; k < numBytesUsed; k++) {
				fprintf(m_outFile, "$%02X%s", data[k], k != numBytesUsed-1 ? ", ":"");
			}
			fprintf(m_outFile, "\n");
		}

		m_nextPC = pc + numBytesUsed;
	}